

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O1

void __thiscall QPDFWriter::writeObjectStream(QPDFWriter *this,QPDFObjectHandle *object)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  element_type *peVar3;
  long lVar4;
  Count *pCVar5;
  int *piVar6;
  undefined8 this_00;
  char cVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  iterator __begin1;
  QPDFObjGen QVar11;
  mapped_type *pmVar12;
  Object *pOVar13;
  long *plVar14;
  undefined8 *puVar15;
  NewObject *pNVar16;
  pointer plVar17;
  iterator __end1;
  ulong uVar18;
  element_type *peVar19;
  string *psVar20;
  void *pvVar21;
  ulong uVar22;
  size_type *psVar23;
  pointer pQVar24;
  char cVar25;
  ulong uVar26;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var27;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var28;
  size_t idx;
  uint uVar29;
  void *__val;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  PipelinePopper pp_ostream;
  QPDFObjectHandle obj_to_write;
  string stream_buffer_pass2;
  string stream_buffer_pass1;
  vector<long_long,_std::allocator<long_long>_> offsets;
  QPDFObjectHandle extends;
  string __str_1;
  int old_id;
  string __str;
  PipelinePopper pp_ostream_pass1;
  string local_1b8;
  undefined1 local_190 [16];
  undefined1 local_180 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  string local_150;
  uint local_12c;
  vector<long_long,_std::allocator<long_long>_> local_128;
  element_type *local_110;
  long local_108;
  QPDFObjectHandle local_100;
  undefined1 local_f0 [32];
  unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> local_d0;
  unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_c0;
  element_type *local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0 [2];
  int local_9c;
  QPDFObjectHandle *local_98;
  __uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> local_90;
  QPDFObjectHandle local_88;
  QPDFObjectHandle local_78;
  long *local_68 [2];
  long local_58 [2];
  pointer local_48;
  PipelinePopper local_40;
  
  local_98 = object;
  QVar11 = QPDFObjectHandle::getObjGen(object);
  if ((ulong)QVar11 >> 0x20 != 0) {
    __assert_fail("old_og.getGen() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFWriter.cc"
                  ,0x674,"void QPDFWriter::writeObjectStream(QPDFObjectHandle)");
  }
  local_9c = QVar11.obj;
  peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar26 = (ulong)local_9c;
  lVar4 = *(long *)&(peVar3->obj).super_ObjTable<QPDFWriter::Object>.
                    super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>.
                    super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>.
                    _M_impl;
  uVar18 = ((long)*(pointer *)
                   ((long)&(peVar3->obj).super_ObjTable<QPDFWriter::Object>.
                           super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>.
                           super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                   + 8) - lVar4 >> 2) * -0x5555555555555555;
  if (uVar18 < uVar26 || uVar18 - uVar26 == 0) {
    pOVar13 = ObjTable<QPDFWriter::Object>::large_element
                        (&(peVar3->obj).super_ObjTable<QPDFWriter::Object>,uVar26);
  }
  else {
    pOVar13 = (Object *)(lVar4 + uVar26 * 0xc);
  }
  local_108 = (long)pOVar13->renumber;
  local_128.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (longlong *)0x0;
  local_128.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (long *)0x0;
  local_128.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (long *)0x0;
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  local_150._M_string_length = 0;
  local_150.field_2._M_local_buf[0] = '\0';
  local_180._16_8_ = &local_160;
  local_180._24_8_ = (void *)0x0;
  local_f0._16_8_ = 0;
  local_160._M_local_buf[0] = '\0';
  peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar3->compress_streams == true) {
    local_f0._16_8_ = CONCAT71((int7)((ulong)peVar3 >> 8),peVar3->qdf_mode) ^ 1;
  }
  local_40.stack_id = 0;
  local_40.qw = this;
  activatePipelineStack(this,&local_40,&local_150);
  pmVar12 = std::
            map<int,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>_>_>_>
            ::operator[](&((this->m).
                           super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->object_stream_to_objects,&local_9c);
  pQVar24 = (pmVar12->super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_48 = (pmVar12->super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  local_110 = (element_type *)this;
  if (pQVar24 == local_48) {
    uVar30 = 0xffffffff;
  }
  else {
    uVar30 = 0xffffffff;
    uVar29 = 0xffffffff;
    do {
      peVar3 = *(element_type **)
                &(((element_type *)this)->value).
                 super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
      ;
      uVar26 = (ulong)pQVar24->obj;
      lVar4 = *(long *)&(peVar3->obj).super_ObjTable<QPDFWriter::Object>.
                        super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>.
                        super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>.
                        _M_impl;
      uVar18 = ((long)*(pointer *)
                       ((long)&(peVar3->obj).super_ObjTable<QPDFWriter::Object>.
                               super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                               .
                               super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                       + 8) - lVar4 >> 2) * -0x5555555555555555;
      if (uVar18 < uVar26 || uVar18 - uVar26 == 0) {
        pOVar13 = ObjTable<QPDFWriter::Object>::large_element
                            (&(peVar3->obj).super_ObjTable<QPDFWriter::Object>,uVar26);
      }
      else {
        pOVar13 = (Object *)(lVar4 + uVar26 * 0xc);
      }
      uVar29 = uVar29 + 1;
      uVar32 = pOVar13->renumber;
      local_f0._24_8_ = ZEXT48(uVar32);
      local_12c = uVar32;
      if (uVar30 != 0xffffffff) {
        local_12c = uVar30;
      }
      if ((*(element_type **)
            &(((element_type *)this)->value).
             super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
          )->qdf_mode != false) {
        uVar30 = -uVar32;
        if (0 < (int)uVar32) {
          uVar30 = uVar32;
        }
        uVar31 = 1;
        if (9 < uVar30) {
          uVar18 = (ulong)uVar30;
          uVar10 = 4;
          do {
            uVar31 = uVar10;
            uVar9 = (uint)uVar18;
            if (uVar9 < 100) {
              uVar31 = uVar31 - 2;
              goto LAB_001efe13;
            }
            if (uVar9 < 1000) {
              uVar31 = uVar31 - 1;
              goto LAB_001efe13;
            }
            if (uVar9 < 10000) goto LAB_001efe13;
            uVar18 = uVar18 / 10000;
            uVar10 = uVar31 + 4;
          } while (99999 < uVar9);
          uVar31 = uVar31 + 1;
        }
LAB_001efe13:
        local_68[0] = local_58;
        std::__cxx11::string::_M_construct
                  ((ulong)local_68,(char)uVar31 - (char)((int)uVar32 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((ulong)(uVar32 >> 0x1f) + (long)local_68[0]),uVar31,uVar30);
        plVar14 = (long *)std::__cxx11::string::replace((ulong)local_68,0,(char *)0x0,0x27edf7);
        local_100.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)local_f0;
        peVar19 = (element_type *)(plVar14 + 2);
        if ((element_type *)*plVar14 == peVar19) {
          local_f0._0_8_ =
               *(undefined8 *)
                &(peVar19->value).
                 super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
          ;
          local_f0._8_8_ = plVar14[3];
        }
        else {
          local_f0._0_8_ =
               *(undefined8 *)
                &(peVar19->value).
                 super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
          ;
          local_100.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)*plVar14;
        }
        local_100.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar14[1];
        *plVar14 = (long)peVar19;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_100);
        peVar19 = (element_type *)(plVar14 + 2);
        if ((element_type *)*plVar14 == peVar19) {
          local_180._0_8_ =
               *(undefined8 *)
                &(peVar19->value).
                 super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
          ;
          local_180._8_8_ = plVar14[3];
          local_190._0_8_ = (element_type *)local_180;
        }
        else {
          local_180._0_8_ =
               *(undefined8 *)
                &(peVar19->value).
                 super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
          ;
          local_190._0_8_ = (element_type *)*plVar14;
        }
        local_190._8_8_ = plVar14[1];
        *plVar14 = (long)peVar19;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        uVar30 = -uVar29;
        if (0 < (int)uVar29) {
          uVar30 = uVar29;
        }
        uVar32 = 1;
        if (9 < uVar30) {
          uVar18 = (ulong)uVar30;
          uVar31 = 4;
          do {
            uVar32 = uVar31;
            uVar10 = (uint)uVar18;
            if (uVar10 < 100) {
              uVar32 = uVar32 - 2;
              goto LAB_001eff84;
            }
            if (uVar10 < 1000) {
              uVar32 = uVar32 - 1;
              goto LAB_001eff84;
            }
            if (uVar10 < 10000) goto LAB_001eff84;
            uVar18 = uVar18 / 10000;
            uVar31 = uVar32 + 4;
          } while (99999 < uVar10);
          uVar32 = uVar32 + 1;
        }
LAB_001eff84:
        local_c0 = local_b0;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_c0,(char)uVar32 - (char)((int)uVar29 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((long)&local_c0->_M_pi + (ulong)(uVar29 >> 0x1f)),uVar32,uVar30);
        this = (QPDFWriter *)local_110;
        p_Var27 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
        if ((element_type *)local_190._0_8_ != (element_type *)local_180) {
          p_Var27 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180._0_8_;
        }
        p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)(_func_int ***)local_190._8_8_ +
                 (long)&(local_b8->
                        super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>
                        ).
                        super__Move_assign_alias<std::__cxx11::basic_string<char>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>
                 );
        if (p_Var27 < p_Var1) {
          _Var28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
          if (local_c0 != local_b0) {
            _Var28._M_pi = local_b0[0]._M_pi;
          }
          if (_Var28._M_pi < p_Var1) goto LAB_001f0027;
          puVar15 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,local_190._0_8_);
        }
        else {
LAB_001f0027:
          puVar15 = (undefined8 *)std::__cxx11::string::_M_append(local_190,(ulong)local_c0);
        }
        psVar23 = puVar15 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar15 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar23) {
          local_1b8.field_2._M_allocated_capacity = *psVar23;
          local_1b8.field_2._8_8_ = puVar15[3];
          local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
        }
        else {
          local_1b8.field_2._M_allocated_capacity = *psVar23;
          local_1b8._M_dataplus._M_p = (pointer)*puVar15;
        }
        local_1b8._M_string_length = puVar15[1];
        *puVar15 = psVar23;
        puVar15[1] = 0;
        *(undefined1 *)psVar23 = 0;
        ::qpdf::pl::Count::write
                  ((*(element_type **)
                     &(((element_type *)this)->value).
                      super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                      .
                      super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                      .
                      super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                      .
                      super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                      .
                      super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                      .
                      super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   )->pipeline,(int)local_1b8._M_dataplus._M_p,(void *)local_1b8._M_string_length,
                   (size_t)psVar23);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
        }
        if (local_c0 != local_b0) {
          operator_delete(local_c0,(ulong)((long)&(local_b0[0]._M_pi)->_vptr__Sp_counted_base + 1));
        }
        if ((element_type *)local_190._0_8_ != (element_type *)local_180) {
          operator_delete((void *)local_190._0_8_,local_180._0_8_ + 1);
        }
        if (local_100.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)local_f0) {
          operator_delete(local_100.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          local_f0._0_8_ + 1);
        }
        if (local_68[0] != local_58) {
          operator_delete(local_68[0],local_58[0] + 1);
        }
        if ((*(element_type **)
              &(((element_type *)this)->value).
               super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               .
               super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               .
               super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               .
               super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               .
               super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               .
               super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            )->suppress_original_object_ids == false) {
          uVar30 = pQVar24->obj;
          uVar32 = -uVar30;
          if (0 < (int)uVar30) {
            uVar32 = uVar30;
          }
          uVar31 = 1;
          if (9 < uVar32) {
            uVar18 = (ulong)uVar32;
            uVar10 = 4;
            do {
              uVar31 = uVar10;
              uVar9 = (uint)uVar18;
              if (uVar9 < 100) {
                uVar31 = uVar31 - 2;
                goto LAB_001f01ad;
              }
              if (uVar9 < 1000) {
                uVar31 = uVar31 - 1;
                goto LAB_001f01ad;
              }
              if (uVar9 < 10000) goto LAB_001f01ad;
              uVar18 = uVar18 / 10000;
              uVar10 = uVar31 + 4;
            } while (99999 < uVar9);
            uVar31 = uVar31 + 1;
          }
LAB_001f01ad:
          local_190._0_8_ = local_180;
          std::__cxx11::string::_M_construct
                    ((ulong)local_190,(char)uVar31 - (char)((int)uVar30 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)(local_190._0_8_ + (ulong)(uVar30 >> 0x1f)),uVar31,uVar32);
          puVar15 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)local_190,0,(char *)0x0,0x27ee1a);
          this = (QPDFWriter *)local_110;
          psVar23 = puVar15 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar15 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar23) {
            local_1b8.field_2._M_allocated_capacity = *psVar23;
            local_1b8.field_2._8_8_ = puVar15[3];
            local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
          }
          else {
            local_1b8.field_2._M_allocated_capacity = *psVar23;
            local_1b8._M_dataplus._M_p = (pointer)*puVar15;
          }
          local_1b8._M_string_length = puVar15[1];
          *puVar15 = psVar23;
          puVar15[1] = 0;
          *(undefined1 *)(puVar15 + 2) = 0;
          ::qpdf::pl::Count::write
                    ((*(element_type **)
                       &(local_110->value).
                        super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                        .
                        super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                        .
                        super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                        .
                        super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                        .
                        super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                        .
                        super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     )->pipeline,(int)local_1b8._M_dataplus._M_p,(void *)local_1b8._M_string_length,
                     (size_t)psVar23);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
            operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
          }
          if ((element_type *)local_190._0_8_ != (element_type *)local_180) {
            operator_delete((void *)local_190._0_8_,local_180._0_8_ + 1);
          }
          if (pQVar24->gen != 0) {
            uVar30 = pQVar24->gen;
            uVar32 = -uVar30;
            if (0 < (int)uVar30) {
              uVar32 = uVar30;
            }
            uVar31 = 1;
            if (9 < uVar32) {
              uVar18 = (ulong)uVar32;
              uVar10 = 4;
              do {
                uVar31 = uVar10;
                uVar9 = (uint)uVar18;
                if (uVar9 < 100) {
                  uVar31 = uVar31 - 2;
                  goto LAB_001f0300;
                }
                if (uVar9 < 1000) {
                  uVar31 = uVar31 - 1;
                  goto LAB_001f0300;
                }
                if (uVar9 < 10000) goto LAB_001f0300;
                uVar18 = uVar18 / 10000;
                uVar10 = uVar31 + 4;
              } while (99999 < uVar9);
              uVar31 = uVar31 + 1;
            }
LAB_001f0300:
            local_190._0_8_ = local_180;
            std::__cxx11::string::_M_construct
                      ((ulong)local_190,(char)uVar31 - (char)((int)uVar30 >> 0x1f));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)(local_190._0_8_ + (ulong)(uVar30 >> 0x1f)),uVar31,uVar32);
            puVar15 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)local_190,0,(char *)0x0,0x27ee66);
            this = (QPDFWriter *)local_110;
            psVar23 = puVar15 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar15 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar23) {
              local_1b8.field_2._M_allocated_capacity = *psVar23;
              local_1b8.field_2._8_8_ = puVar15[3];
              local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
            }
            else {
              local_1b8.field_2._M_allocated_capacity = *psVar23;
              local_1b8._M_dataplus._M_p = (pointer)*puVar15;
            }
            local_1b8._M_string_length = puVar15[1];
            *puVar15 = psVar23;
            puVar15[1] = 0;
            *(undefined1 *)(puVar15 + 2) = 0;
            ::qpdf::pl::Count::write
                      ((*(element_type **)
                         &(local_110->value).
                          super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                          .
                          super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                          .
                          super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                          .
                          super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                          .
                          super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                          .
                          super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                       )->pipeline,(int)local_1b8._M_dataplus._M_p,
                       (void *)local_1b8._M_string_length,(size_t)psVar23);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
              operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((element_type *)local_190._0_8_ != (element_type *)local_180) {
              operator_delete((void *)local_190._0_8_,local_180._0_8_ + 1);
            }
          }
        }
        ::qpdf::pl::Count::write
                  ((*(element_type **)
                     &(((element_type *)this)->value).
                      super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                      .
                      super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                      .
                      super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                      .
                      super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                      .
                      super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                      .
                      super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   )->pipeline,0x27efc7,(void *)0x1,(size_t)psVar23);
      }
      pCVar5 = (*(element_type **)
                 &(((element_type *)this)->value).
                  super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                  .
                  super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                  .
                  super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                  .
                  super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                  .
                  super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                  .
                  super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               )->pipeline;
      psVar20 = pCVar5->str;
      psVar23 = (size_type *)&pCVar5->count;
      if (psVar20 != (string *)0x0) {
        psVar23 = &psVar20->_M_string_length;
      }
      local_1b8._M_dataplus._M_p = (pointer)*psVar23;
      if (local_128.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_128.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<long_long,_std::allocator<long_long>_>::_M_realloc_insert<long_long>
                  (&local_128,
                   (iterator)
                   local_128.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                   super__Vector_impl_data._M_finish,(longlong *)&local_1b8);
      }
      else {
        *local_128.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
         super__Vector_impl_data._M_finish = (longlong)local_1b8._M_dataplus._M_p;
        local_128.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_128.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      peVar3 = *(element_type **)
                &(((element_type *)this)->value).
                 super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
      ;
      piVar6 = &peVar3->events_seen;
      *piVar6 = *piVar6 + -1;
      QPDF::getObject((QPDF *)local_190,(QPDFObjGen)peVar3->pdf);
      bVar8 = QPDFObjectHandle::isStream((QPDFObjectHandle *)local_190);
      if (bVar8) {
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1b8,"stream found inside object stream; treating as null","");
        QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)local_190,&local_1b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
        }
        QPDFObjectHandle::newNull();
        this_00 = local_190._8_8_;
        local_190._8_8_ = local_1b8._M_string_length;
        local_190._0_8_ = local_1b8._M_dataplus._M_p;
        local_1b8._M_dataplus._M_p = (pointer)0x0;
        local_1b8._M_string_length = 0;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._M_string_length);
        }
      }
      local_78.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_190._0_8_;
      local_78.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_190._8_8_ + 8) = *(_Atomic_word *)(local_190._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_190._8_8_ + 8) = *(_Atomic_word *)(local_190._8_8_ + 8) + 1;
        }
      }
      writeObject(this,&local_78,uVar29);
      if (local_78.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      peVar3 = *(element_type **)
                &(((element_type *)this)->value).
                 super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
      ;
      idx = (size_t)(int)local_f0._24_4_;
      lVar4 = *(long *)&(peVar3->new_obj).super_ObjTable<QPDFWriter::NewObject>.
                        super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>.
                        super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                        ._M_impl;
      if (idx < (ulong)((long)*(pointer *)
                               ((long)&(peVar3->new_obj).super_ObjTable<QPDFWriter::NewObject>.
                                       super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                                       .
                                       super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                               + 8) - lVar4 >> 5)) {
        pNVar16 = (NewObject *)(lVar4 + idx * 0x20);
      }
      else {
        pNVar16 = ObjTable<QPDFWriter::NewObject>::large_element
                            (&(peVar3->new_obj).super_ObjTable<QPDFWriter::NewObject>,idx);
      }
      uVar30 = local_12c;
      (pNVar16->xref).type = 2;
      (pNVar16->xref).field1 = local_108;
      (pNVar16->xref).field2 = uVar29;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_);
      }
      pQVar24 = pQVar24 + 1;
    } while (pQVar24 != local_48);
  }
  PipelinePopper::~PipelinePopper(&local_40);
  local_1b8._M_string_length = 0;
  local_1b8._M_dataplus._M_p = (pointer)this;
  if (local_128.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_128.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  }
  lVar4 = *local_128.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  plVar17 = local_128.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    *plVar17 = *plVar17 - lVar4;
    plVar17 = plVar17 + 1;
  } while (plVar17 !=
           local_128.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
           super__Vector_impl_data._M_finish);
  local_190._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_90._M_t.super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
  super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
       (tuple<qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>)
       (_Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>)0x0;
  local_190._0_8_ = this;
  activatePipelineStack
            (this,(PipelinePopper *)local_190,true,(string *)0x0,
             (unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)&local_90);
  std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr
            ((unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)&local_90);
  writeObjectStreamOffsets(this,&local_128,uVar30);
  pCVar5 = (*(element_type **)
             &(((element_type *)this)->value).
              super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
              .
              super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
              .
              super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
              .
              super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
              .
              super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
              .
              super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
           )->pipeline;
  psVar20 = pCVar5->str;
  psVar23 = (size_type *)&pCVar5->count;
  if (psVar20 != (string *)0x0) {
    psVar23 = &psVar20->_M_string_length;
  }
  uVar18 = lVar4 + *psVar23;
  PipelinePopper::~PipelinePopper((PipelinePopper *)local_190);
  if (local_f0[0x10] == '\0') {
    activatePipelineStack(this,(PipelinePopper *)&local_1b8,(string *)(local_180 + 0x10));
  }
  else {
    ::qpdf::pl::create<qpdf::pl::String,std::__cxx11::string&>
              ((pl *)&local_d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_180 + 0x10));
    local_190._0_4_ = 1;
    ::qpdf::pl::create<Pl_Flate,Pl_Flate::action_e>((pl *)&local_c8,&local_d0,(action_e *)local_190)
    ;
    activatePipelineStack(this,(PipelinePopper *)&local_1b8,&local_c8);
    std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr(&local_c8);
    std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr(&local_d0);
  }
  writeObjectStreamOffsets(this,&local_128,uVar30);
  ::qpdf::pl::Count::write
            ((*(element_type **)
               &(((element_type *)this)->value).
                super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             )->pipeline,(int)local_150._M_dataplus._M_p,(void *)local_150._M_string_length,
             (size_t)psVar20);
  local_150._M_string_length = 0;
  *local_150._M_dataplus._M_p = '\0';
  std::__cxx11::string::reserve();
  PipelinePopper::~PipelinePopper((PipelinePopper *)&local_1b8);
  openObject(this,(int)local_108);
  setDataKey(this,(int)local_108);
  ::qpdf::pl::Count::write
            ((*(element_type **)
               &(((element_type *)this)->value).
                super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             )->pipeline,0x27ec04,(void *)0x2,(size_t)psVar20);
  peVar3 = *(element_type **)
            &(((element_type *)this)->value).
             super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
  ;
  if (peVar3->qdf_mode == true) {
    ::qpdf::pl::Count::write(peVar3->pipeline,0x27ee65,(void *)0x2,(size_t)psVar20);
  }
  ::qpdf::pl::Count::write
            ((*(element_type **)
               &(((element_type *)this)->value).
                super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             )->pipeline,0x27ee68,(void *)0xe,(size_t)psVar20);
  peVar3 = *(element_type **)
            &(((element_type *)this)->value).
             super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
  ;
  if (peVar3->qdf_mode == true) {
    ::qpdf::pl::Count::write(peVar3->pipeline,0x27ee65,(void *)0x2,(size_t)psVar20);
  }
  peVar3 = *(element_type **)
            &(((element_type *)this)->value).
             super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
  ;
  __val = (void *)local_180._24_8_;
  if (((peVar3->encrypted == true) && ((peVar3->cur_data_key)._M_string_length != 0)) &&
     (peVar3->encrypt_use_aes == true)) {
    __val = (void *)((local_180._24_8_ & 0xfffffffffffffff0) + 0x20);
  }
  cVar25 = '\x01';
  if ((void *)0x9 < __val) {
    pvVar21 = __val;
    cVar7 = '\x04';
    do {
      cVar25 = cVar7;
      if (pvVar21 < (void *)0x64) {
        cVar25 = cVar25 + -2;
        goto LAB_001f0877;
      }
      if (pvVar21 < (void *)0x3e8) {
        cVar25 = cVar25 + -1;
        goto LAB_001f0877;
      }
      if (pvVar21 < (void *)0x2710) goto LAB_001f0877;
      bVar8 = (void *)0x1869f < pvVar21;
      pvVar21 = (void *)((ulong)pvVar21 / 10000);
      cVar7 = cVar25 + '\x04';
    } while (bVar8);
    cVar25 = cVar25 + '\x01';
  }
LAB_001f0877:
  local_190._0_8_ = (element_type *)local_180;
  std::__cxx11::string::_M_construct((ulong)local_190,cVar25);
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)local_190._0_8_,local_190._8_4_,(unsigned_long)__val);
  plVar14 = (long *)std::__cxx11::string::replace((ulong)local_190,0,(char *)0x0,0x27e868);
  paVar2 = &local_1b8.field_2;
  psVar23 = (size_type *)(plVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar23) {
    local_1b8.field_2._M_allocated_capacity = *psVar23;
    local_1b8.field_2._8_8_ = plVar14[3];
    local_1b8._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_1b8.field_2._M_allocated_capacity = *psVar23;
    local_1b8._M_dataplus._M_p = (pointer)*plVar14;
  }
  local_1b8._M_string_length = plVar14[1];
  *plVar14 = (long)psVar23;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  ::qpdf::pl::Count::write
            ((*(element_type **)
               &(((element_type *)this)->value).
                super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             )->pipeline,(int)local_1b8._M_dataplus._M_p,(void *)local_1b8._M_string_length,
             (size_t)psVar23);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((element_type *)local_190._0_8_ != (element_type *)local_180) {
    operator_delete((void *)local_190._0_8_,local_180._0_8_ + 1);
  }
  peVar3 = *(element_type **)
            &(((element_type *)this)->value).
             super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
  ;
  if (peVar3->qdf_mode == true) {
    ::qpdf::pl::Count::write(peVar3->pipeline,0x27ee65,(void *)0x2,(size_t)psVar23);
  }
  if (local_f0[0x10] != '\0') {
    ::qpdf::pl::Count::write
              ((*(element_type **)
                 &(((element_type *)this)->value).
                  super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                  .
                  super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                  .
                  super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                  .
                  super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                  .
                  super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                  .
                  super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               )->pipeline,0x27ee77,(void *)0x15,(size_t)psVar23);
  }
  uVar26 = (long)local_128.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_128.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  cVar25 = '\x01';
  if (9 < uVar26) {
    uVar22 = uVar26;
    cVar7 = '\x04';
    do {
      cVar25 = cVar7;
      if (uVar22 < 100) {
        cVar25 = cVar25 + -2;
        goto LAB_001f09fb;
      }
      if (uVar22 < 1000) {
        cVar25 = cVar25 + -1;
        goto LAB_001f09fb;
      }
      if (uVar22 < 10000) goto LAB_001f09fb;
      bVar8 = 99999 < uVar22;
      uVar22 = uVar22 / 10000;
      cVar7 = cVar25 + '\x04';
    } while (bVar8);
    cVar25 = cVar25 + '\x01';
  }
LAB_001f09fb:
  local_190._0_8_ = (element_type *)local_180;
  std::__cxx11::string::_M_construct((ulong)local_190,cVar25);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_190._0_8_,local_190._8_4_,uVar26);
  plVar14 = (long *)std::__cxx11::string::replace((ulong)local_190,0,(char *)0x0,0x27ee8d);
  psVar23 = (size_type *)(plVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar23) {
    local_1b8.field_2._M_allocated_capacity = *psVar23;
    local_1b8.field_2._8_8_ = plVar14[3];
    local_1b8._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_1b8.field_2._M_allocated_capacity = *psVar23;
    local_1b8._M_dataplus._M_p = (pointer)*plVar14;
  }
  local_1b8._M_string_length = plVar14[1];
  *plVar14 = (long)psVar23;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  ::qpdf::pl::Count::write
            ((*(element_type **)
               &(((element_type *)this)->value).
                super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             )->pipeline,(int)local_1b8._M_dataplus._M_p,(void *)local_1b8._M_string_length,
             (size_t)psVar23);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((element_type *)local_190._0_8_ != (element_type *)local_180) {
    operator_delete((void *)local_190._0_8_,local_180._0_8_ + 1);
  }
  peVar3 = *(element_type **)
            &(((element_type *)this)->value).
             super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
  ;
  if (peVar3->qdf_mode == true) {
    ::qpdf::pl::Count::write(peVar3->pipeline,0x27ee65,(void *)0x2,(size_t)psVar23);
  }
  uVar26 = -uVar18;
  if (0 < (long)uVar18) {
    uVar26 = uVar18;
  }
  uVar30 = 1;
  if (9 < uVar26) {
    uVar22 = uVar26;
    uVar29 = 4;
    do {
      uVar30 = uVar29;
      if (uVar22 < 100) {
        uVar30 = uVar30 - 2;
        goto LAB_001f0b4c;
      }
      if (uVar22 < 1000) {
        uVar30 = uVar30 - 1;
        goto LAB_001f0b4c;
      }
      if (uVar22 < 10000) goto LAB_001f0b4c;
      bVar8 = 99999 < uVar22;
      uVar22 = uVar22 / 10000;
      uVar29 = uVar30 + 4;
    } while (bVar8);
    uVar30 = uVar30 + 1;
  }
LAB_001f0b4c:
  local_190._0_8_ = (element_type *)local_180;
  std::__cxx11::string::_M_construct((ulong)local_190,(char)uVar30 - (char)((long)uVar18 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long_long>
            ((char *)(local_190._0_8_ + -((long)uVar18 >> 0x3f)),uVar30,uVar26);
  plVar14 = (long *)std::__cxx11::string::replace((ulong)local_190,0,(char *)0x0,0x27ee92);
  peVar19 = local_110;
  psVar23 = (size_type *)(plVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar23) {
    local_1b8.field_2._M_allocated_capacity = *psVar23;
    local_1b8.field_2._8_8_ = plVar14[3];
    local_1b8._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_1b8.field_2._M_allocated_capacity = *psVar23;
    local_1b8._M_dataplus._M_p = (pointer)*plVar14;
  }
  local_1b8._M_string_length = plVar14[1];
  *plVar14 = (long)psVar23;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  ::qpdf::pl::Count::write
            ((*(element_type **)
               &(local_110->value).
                super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             )->pipeline,(int)local_1b8._M_dataplus._M_p,(void *)local_1b8._M_string_length,
             (size_t)psVar23);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((element_type *)local_190._0_8_ != (element_type *)local_180) {
    operator_delete((void *)local_190._0_8_,local_180._0_8_ + 1);
  }
  bVar8 = QPDFObjectHandle::isNull(local_98);
  if (!bVar8) {
    QPDFObjectHandle::getDict((QPDFObjectHandle *)local_190);
    local_1b8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"/Extends","");
    QPDFObjectHandle::getKey(&local_100,(string *)local_190);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    bVar8 = QPDFObjectHandle::isIndirect(&local_100);
    if (bVar8) {
      peVar3 = *(element_type **)
                &(peVar19->value).
                 super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
      ;
      if (peVar3->qdf_mode == true) {
        ::qpdf::pl::Count::write(peVar3->pipeline,0x27ee65,(void *)0x2,(size_t)psVar23);
      }
      ::qpdf::pl::Count::write
                ((*(element_type **)
                   &(peVar19->value).
                    super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    .
                    super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    .
                    super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    .
                    super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    .
                    super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    .
                    super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 )->pipeline,0x27eea4,(void *)0xa,(size_t)psVar23);
      local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = local_100.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           local_100.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if (local_100.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_100.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_100.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_100.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_100.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
        }
      }
      psVar23 = (size_type *)0x4;
      unparseChild((QPDFWriter *)peVar19,&local_88,1,4);
      if (local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_88.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
    }
    if (local_100.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_100.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_);
    }
  }
  peVar3 = *(element_type **)
            &(peVar19->value).
             super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
  ;
  if (peVar3->qdf_mode == true) {
    ::qpdf::pl::Count::write(peVar3->pipeline,0x27efc7,(void *)0x1,(size_t)psVar23);
  }
  peVar3 = *(element_type **)
            &(peVar19->value).
             super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
  ;
  if (peVar3->qdf_mode == false) {
    ::qpdf::pl::Count::write(peVar3->pipeline,0x27ee66,(void *)0x1,(size_t)psVar23);
  }
  ::qpdf::pl::Count::write
            ((*(element_type **)
               &(peVar19->value).
                super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             )->pipeline,0x27efe4,(void *)0xa,(size_t)psVar23);
  local_1b8._M_dataplus._M_p = (pointer)peVar19;
  local_1b8._M_string_length = 0;
  pushEncryptionFilter((QPDFWriter *)peVar19,(PipelinePopper *)&local_1b8);
  ::qpdf::pl::Count::write
            ((*(element_type **)
               &(peVar19->value).
                super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             )->pipeline,(int)local_180._16_8_,(void *)local_180._24_8_,(size_t)psVar23);
  PipelinePopper::~PipelinePopper((PipelinePopper *)&local_1b8);
  peVar3 = *(element_type **)
            &(peVar19->value).
             super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
  ;
  if (peVar3->newline_before_endstream == true) {
    ::qpdf::pl::Count::write(peVar3->pipeline,0x27efc7,(void *)0x1,(size_t)psVar23);
  }
  ::qpdf::pl::Count::write
            ((*(element_type **)
               &(peVar19->value).
                super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             )->pipeline,0x27f07f,(void *)0x9,(size_t)psVar23);
  peVar3 = *(element_type **)
            &(peVar19->value).
             super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
  ;
  (peVar3->cur_data_key)._M_string_length = 0;
  *(peVar3->cur_data_key)._M_dataplus._M_p = '\0';
  closeObject((QPDFWriter *)peVar19,(int)local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._16_8_ != &local_160) {
    operator_delete((void *)local_180._16_8_,
                    CONCAT71(local_160._M_allocated_capacity._1_7_,local_160._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,
                    CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                             local_150.field_2._M_local_buf[0]) + 1);
  }
  if (local_128.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (long *)0x0) {
    operator_delete(local_128.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.super__Vector_base<long_long,_std::allocator<long_long>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.super__Vector_base<long_long,_std::allocator<long_long>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
QPDFWriter::writeObjectStream(QPDFObjectHandle object)
{
    // Note: object might be null if this is a place-holder for an object stream that we are
    // generating from scratch.

    QPDFObjGen old_og = object.getObjGen();
    qpdf_assert_debug(old_og.getGen() == 0);
    int old_id = old_og.getObj();
    int new_stream_id = m->obj[old_og].renumber;

    std::vector<qpdf_offset_t> offsets;
    qpdf_offset_t first = 0;

    // Generate stream itself.  We have to do this in two passes so we can calculate offsets in the
    // first pass.
    std::string stream_buffer_pass1;
    std::string stream_buffer_pass2;
    int first_obj = -1;
    const bool compressed = m->compress_streams && !m->qdf_mode;
    {
        // Pass 1
        PipelinePopper pp_ostream_pass1(this);
        activatePipelineStack(pp_ostream_pass1, stream_buffer_pass1);

        int count = -1;
        for (auto const& obj: m->object_stream_to_objects[old_id]) {
            ++count;
            int new_obj = m->obj[obj].renumber;
            if (first_obj == -1) {
                first_obj = new_obj;
            }
            if (m->qdf_mode) {
                writeString(
                    "%% Object stream: object " + std::to_string(new_obj) + ", index " +
                    std::to_string(count));
                if (!m->suppress_original_object_ids) {
                    writeString("; original object ID: " + std::to_string(obj.getObj()));
                    // For compatibility, only write the generation if non-zero.  While object
                    // streams only allow objects with generation 0, if we are generating object
                    // streams, the old object could have a non-zero generation.
                    if (obj.getGen() != 0) {
                        QTC::TC("qpdf", "QPDFWriter original obj non-zero gen");
                        writeString(" " + std::to_string(obj.getGen()));
                    }
                }
                writeString("\n");
            }

            offsets.push_back(m->pipeline->getCount());
            // To avoid double-counting objects being written in object streams for progress
            // reporting, decrement in pass 1.
            indicateProgress(true, false);

            QPDFObjectHandle obj_to_write = m->pdf.getObject(obj);
            if (obj_to_write.isStream()) {
                // This condition occurred in a fuzz input. Ideally we should block it at parse
                // time, but it's not clear to me how to construct a case for this.
                obj_to_write.warnIfPossible("stream found inside object stream; treating as null");
                obj_to_write = QPDFObjectHandle::newNull();
            }
            writeObject(obj_to_write, count);

            m->new_obj[new_obj].xref = QPDFXRefEntry(new_stream_id, count);
        }
    }
    {
        PipelinePopper pp_ostream(this);
        // Adjust offsets to skip over comment before first object
        first = offsets.at(0);
        for (auto& iter: offsets) {
            iter -= first;
        }

        // Take one pass at writing pairs of numbers so we can get their size information
        {
            PipelinePopper pp_discard(this);
            activatePipelineStack(pp_discard, true);
            writeObjectStreamOffsets(offsets, first_obj);
            first += m->pipeline->getCount();
        }

        // Set up a stream to write the stream data into a buffer.
        if (compressed) {
            activatePipelineStack(
                pp_ostream,
                pl::create<Pl_Flate>(
                    pl::create<pl::String>(stream_buffer_pass2), Pl_Flate::a_deflate));
        } else {
            activatePipelineStack(pp_ostream, stream_buffer_pass2);
        }
        writeObjectStreamOffsets(offsets, first_obj);
        writeString(stream_buffer_pass1);
        stream_buffer_pass1.clear();
        stream_buffer_pass1.shrink_to_fit();
    }

    // Write the object
    openObject(new_stream_id);
    setDataKey(new_stream_id);
    writeString("<<");
    writeStringQDF("\n ");
    writeString(" /Type /ObjStm");
    writeStringQDF("\n ");
    size_t length = stream_buffer_pass2.size();
    adjustAESStreamLength(length);
    writeString(" /Length " + std::to_string(length));
    writeStringQDF("\n ");
    if (compressed) {
        writeString(" /Filter /FlateDecode");
    }
    writeString(" /N " + std::to_string(offsets.size()));
    writeStringQDF("\n ");
    writeString(" /First " + std::to_string(first));
    if (!object.isNull()) {
        // If the original object has an /Extends key, preserve it.
        QPDFObjectHandle dict = object.getDict();
        QPDFObjectHandle extends = dict.getKey("/Extends");
        if (extends.isIndirect()) {
            QTC::TC("qpdf", "QPDFWriter copy Extends");
            writeStringQDF("\n ");
            writeString(" /Extends ");
            unparseChild(extends, 1, f_in_ostream);
        }
    }
    writeStringQDF("\n");
    writeStringNoQDF(" ");
    writeString(">>\nstream\n");
    if (m->encrypted) {
        QTC::TC("qpdf", "QPDFWriter encrypt object stream");
    }
    {
        PipelinePopper pp_enc(this);
        pushEncryptionFilter(pp_enc);
        writeString(stream_buffer_pass2);
    }
    if (m->newline_before_endstream) {
        writeString("\n");
    }
    writeString("endstream");
    m->cur_data_key.clear();
    closeObject(new_stream_id);
}